

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

learner<cbify,_example> *
LEARNER::
init_multiclass_learner<cbify,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
          (free_ptr<cbify> *dat,
          learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *base,
          _func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
          *learn,_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                 *predict,parser *p,size_t ws,prediction_type_t pred_type)

{
  learner<cbify,_example> *this;
  _func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
  *in_RCX;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_RDX;
  cbify *in_RSI;
  _func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
  *in_R8;
  unique_ptr<cbify,_void_(*)(void_*)> *in_R9;
  learner<cbify,_example> *l;
  undefined8 in_stack_ffffffffffffffc8;
  prediction_type_t pred_type_00;
  
  pred_type_00 = (prediction_type_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  std::unique_ptr<cbify,_void_(*)(void_*)>::get(in_R9);
  this = learner<cbify,example>::
         init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                   (in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_R9,pred_type_00);
  std::unique_ptr<cbify,_void_(*)(void_*)>::release((unique_ptr<cbify,_void_(*)(void_*)> *)0x2f510f)
  ;
  learner<cbify,_example>::set_finish_example(this,MULTICLASS::finish_example<cbify>);
  memcpy(in_R8 + 0x330,MULTICLASS::mc_label,0x48);
  return this;
}

Assistant:

learner<T, E>& init_multiclass_learner(free_ptr<T>& dat, L* base, void (*learn)(T&, L&, E&),
    void (*predict)(T&, L&, E&), parser* p, size_t ws,
    prediction_type::prediction_type_t pred_type = prediction_type::multiclass)
{
  learner<T, E>& l = learner<T, E>::init_learner(dat.get(), base, learn, predict, ws, pred_type);

  dat.release();
  l.set_finish_example(MULTICLASS::finish_example<T>);
  p->lp = MULTICLASS::mc_label;
  return l;
}